

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

void spvtools::val::anon_unknown_11::UpdateFeaturesBasedOnSpirvVersion
               (Feature *features,uint32_t version)

{
  uint32_t version_local;
  Feature *features_local;
  
  if (features != (Feature *)0x0) {
    if (0x103ff < version) {
      features->select_between_composites = true;
      features->copy_memory_permits_two_memory_accesses = true;
      features->uconvert_spec_constant_op = true;
      features->nonwritable_var_in_function_or_private = true;
    }
    return;
  }
  __assert_fail("features",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                ,0x89,
                "void spvtools::val::(anonymous namespace)::UpdateFeaturesBasedOnSpirvVersion(ValidationState_t::Feature *, uint32_t)"
               );
}

Assistant:

void UpdateFeaturesBasedOnSpirvVersion(ValidationState_t::Feature* features,
                                       uint32_t version) {
  assert(features);
  if (version >= SPV_SPIRV_VERSION_WORD(1, 4)) {
    features->select_between_composites = true;
    features->copy_memory_permits_two_memory_accesses = true;
    features->uconvert_spec_constant_op = true;
    features->nonwritable_var_in_function_or_private = true;
  }
}